

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCMaterial.cpp
# Opt level: O2

uint Assimp::IFC::ProcessMaterials
               (uint64_t id,uint prevMatId,ConversionData *conv,bool forceDefaultMat)

{
  Out *__lhs;
  Lazy *pLVar1;
  __shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer ppaVar4;
  pointer ppaVar5;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> uVar6;
  IfcSurfaceStyle *pIVar7;
  size_type sVar8;
  bool bVar9;
  LazyObject *this;
  IfcStyledItem *pIVar10;
  IfcPresentationStyleAssignment *pIVar11;
  IfcSurfaceStyle *pIVar12;
  iterator iVar13;
  __uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true> _Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar15;
  IfcSurfaceStyleShading *pIVar16;
  IfcColourRgb *in;
  IfcSurfaceStyleRendering *pIVar17;
  double *pdVar18;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> *psVar19;
  PrimitiveDataType<double> *pPVar20;
  mapped_type_conflict3 *pmVar21;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var22;
  int iVar23;
  __shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2> *p_Var25;
  Lazy *this_00;
  uint uVar26;
  ulong unaff_R15;
  size_t a;
  __shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2> *p_Var27;
  pair<std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::_Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  pVar28;
  allocator local_969;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat_1;
  IfcSurfaceStyle *surf;
  aiColor4D col;
  int shading;
  aiColor4D col_base;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sel;
  shared_ptr<const_Assimp::STEP::EXPRESS::DataType> sel2;
  unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_> mat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_890;
  uint64_t id_local;
  string side;
  float t;
  float fStack_844;
  undefined1 auStack_843 [3];
  size_type sStack_840;
  aiString name;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_unsigned_long>_> _Var24;
  
  id_local = id;
  pVar28 = std::
           _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::_Select1st<std::pair<const_unsigned_long,_unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
           ::equal_range(&(conv->db->refs)._M_t,&id_local);
  _Var24 = pVar28.second._M_node;
  while (_Var22 = pVar28.first._M_node, _Var22._M_node != pVar28.second._M_node._M_node) {
    this = STEP::DB::GetObject(conv->db,(uint64_t)_Var22._M_node[1]._M_parent);
    pIVar10 = STEP::LazyObject::ToPtr<Assimp::IFC::Schema_2x3::IfcStyledItem>(this);
    if (pIVar10 != (IfcStyledItem *)0x0) {
      pLVar1 = *(Lazy **)&pIVar10->field_0x38;
      for (this_00 = *(Lazy **)&(pIVar10->
                                super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStyledItem,_3UL>).
                                field_0x20; this_00 != pLVar1; this_00 = this_00 + 8) {
        pIVar11 = STEP::Lazy::operator_cast_to_IfcPresentationStyleAssignment_(this_00);
        p_Var25 = *(__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                    **)&(pIVar11->
                        super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                        ).field_0x10;
        p_Var2 = *(__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                   **)&(pIVar11->
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyleAssignment,_1UL>
                       ).field_0x18;
        while (p_Var25 != p_Var2) {
          std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr(&sel.
                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                       ,p_Var25);
          pIVar12 = STEP::EXPRESS::DataType::
                    ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyle>
                              (sel.
                               super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr,conv->db);
          surf = pIVar12;
          if (pIVar12 != (IfcSurfaceStyle *)0x0) {
            iVar13 = std::
                     _Rb_tree<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>,_std::_Select1st<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                     ::find(&(conv->cached_materials)._M_t,&surf);
            if ((_Rb_tree_header *)iVar13._M_node ==
                &(conv->cached_materials)._M_t._M_impl.super__Rb_tree_header) {
              std::__cxx11::string::string
                        ((string *)&side,(string *)&(surf->super_IfcPresentationStyle).field_0x48);
              bVar9 = std::operator!=(&side,"BOTH");
              if (bVar9) {
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &t,"ignoring surface side marker on IFC::IfcSurfaceStyle: ",&side);
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                basic_formatter<std::__cxx11::string>
                          ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                           &name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&t);
                LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&name);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&name);
                std::__cxx11::string::~string((string *)&t);
              }
              _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
              super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
              super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                   (__uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>)operator_new(0x10)
              ;
              aiMaterial::aiMaterial
                        ((aiMaterial *)
                         _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>.
                         _M_t.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                         .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl);
              pIVar7 = surf;
              name._0_8_ = name._0_8_ & 0xffffff0000000000;
              mat_1._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
              super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
              super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                   (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
                   (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
                   _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
                   super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                   super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
              memset(name.data + 1,0x1b,0x3ff);
              if ((pIVar7->super_IfcPresentationStyle).field_0x30 == '\x01') {
                pbVar15 = STEP::
                          Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          ::Get((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)&(pIVar7->super_IfcPresentationStyle).
                                    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcPresentationStyle,_1UL>
                                    .field_0x10);
                std::__cxx11::string::string((string *)&t,(string *)pbVar15);
              }
              else {
                std::__cxx11::string::string((string *)&t,"IfcSurfaceStyle_Unnamed",&local_969);
              }
              sVar8 = sStack_840;
              if (sStack_840 < 0x400) {
                name.length = (ai_uint32)sStack_840;
                memcpy(name.data,_t,sStack_840);
                name.data[sVar8] = '\0';
              }
              std::__cxx11::string::~string((string *)&t);
              aiMaterial::AddProperty
                        ((aiMaterial *)
                         _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>.
                         _M_t.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                         .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&name,"?mat.name",
                         0,0);
              p_Var3 = &((pIVar7->Styles).
                         super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                         .
                         super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->
                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
              ;
              for (p_Var27 = &((pIVar7->Styles).
                               super_vector<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                               .
                               super__Vector_base<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>,_std::allocator<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                  ; uVar6._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>.
                    _M_t.super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                    super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                         mat_1._M_t.
                         super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
                         super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                         super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl, p_Var27 != p_Var3;
                  p_Var27 = p_Var27 + 1) {
                std::__shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                ::__shared_ptr(&sel2.
                                super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                               ,p_Var27);
                pIVar16 = STEP::EXPRESS::DataType::
                          ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading>
                                    (sel2.
                                     super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr,conv->db);
                if (pIVar16 != (IfcSurfaceStyleShading *)0x0) {
                  col_base.r = 0.0;
                  col_base.g = 0.0;
                  col_base.b = 0.0;
                  col_base.a = 0.0;
                  col.r = 0.0;
                  col.g = 0.0;
                  col.b = 0.0;
                  col.a = 0.0;
                  in = STEP::Lazy::operator_cast_to_IfcColourRgb_
                                 ((Lazy *)&(pIVar16->
                                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                           ).field_0x10);
                  ConvertColor(&col_base,in);
                  aiMaterial::AddProperty
                            ((aiMaterial *)
                             _Var14.
                             super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                             super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&col_base,1,
                             "$clr.diffuse",0,0);
                  pIVar17 = STEP::Object::ToPtr<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering>
                                      ((Object *)
                                       ((long)&(pIVar16->
                                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                               )._vptr_ObjectHelper +
                                       (long)(pIVar16->
                                             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>
                                             )._vptr_ObjectHelper[-3]));
                  if (pIVar17 != (IfcSurfaceStyleRendering *)0x0) {
                    if (pIVar17->field_0x30 == '\x01') {
                      pdVar18 = STEP::Maybe<double>::Get
                                          ((Maybe<double> *)
                                           &(pIVar17->super_IfcSurfaceStyleShading).field_0x28);
                      t = 1.0 - (float)*pdVar18;
                      aiMaterial::AddProperty
                                ((aiMaterial *)
                                 _Var14.
                                 super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                 .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&t,1,
                                 "$mat.opacity",0,0);
                    }
                    if ((pIVar17->DiffuseColour).have == true) {
                      psVar19 = STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>
                                ::Get(&pIVar17->DiffuseColour);
                      ConvertColor(&col,(psVar19->
                                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr,conv,&col_base);
                      aiMaterial::AddProperty
                                ((aiMaterial *)
                                 _Var14.
                                 super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                 .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&col,1,
                                 "$clr.diffuse",0,0);
                    }
                    if ((pIVar17->SpecularColour).have == true) {
                      psVar19 = STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>
                                ::Get(&pIVar17->SpecularColour);
                      ConvertColor(&col,(psVar19->
                                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr,conv,&col_base);
                      aiMaterial::AddProperty
                                ((aiMaterial *)
                                 _Var14.
                                 super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                 .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&col,1,
                                 "$clr.specular",0,0);
                    }
                    if ((pIVar17->TransmissionColour).have == true) {
                      psVar19 = STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>
                                ::Get(&pIVar17->TransmissionColour);
                      ConvertColor(&col,(psVar19->
                                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr,conv,&col_base);
                      aiMaterial::AddProperty
                                ((aiMaterial *)
                                 _Var14.
                                 super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                 .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&col,1,
                                 "$clr.transparent",0,0);
                    }
                    if ((pIVar17->ReflectionColour).have == true) {
                      psVar19 = STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>
                                ::Get(&pIVar17->ReflectionColour);
                      ConvertColor(&col,(psVar19->
                                        super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                        )._M_ptr,conv,&col_base);
                      aiMaterial::AddProperty
                                ((aiMaterial *)
                                 _Var14.
                                 super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                 .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&col,1,
                                 "$clr.reflective",0,0);
                    }
                    iVar23 = 2;
                    if (((pIVar17->SpecularHighlight).have == true) &&
                       ((pIVar17->SpecularColour).have == true)) {
                      __lhs = &pIVar17->ReflectanceMethod;
                      bVar9 = std::operator==(__lhs,"BLINN");
                      iVar23 = 4;
                      if (!bVar9) {
                        bVar9 = std::operator==(__lhs,"FLAT");
                        iVar23 = 9;
                        if (!bVar9) {
                          bVar9 = std::operator==(__lhs,"NOTDEFINED");
                          iVar23 = 9;
                          if (!bVar9) {
                            bVar9 = std::operator==(__lhs,"PHONG");
                            iVar23 = 3;
                            if (!bVar9) {
                              std::operator+(&local_890,"shading mode ",__lhs);
                              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&mat,&local_890,
                                             " not recognized by Assimp, using Phong instead");
                              Formatter::
                              basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                              basic_formatter<std::__cxx11::string>
                                        ((basic_formatter<char,std::char_traits<char>,std::allocator<char>>
                                          *)&t,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&mat);
                              LogFunctions<Assimp::IFCImporter>::LogWarn((format *)&t);
                              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&t);
                              std::__cxx11::string::~string((string *)&mat);
                              std::__cxx11::string::~string((string *)&local_890);
                              iVar23 = 3;
                            }
                          }
                        }
                      }
                    }
                    shading = iVar23;
                    aiMaterial::AddProperty
                              ((aiMaterial *)
                               _Var14.
                               super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                               .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&shading,1,
                               "$mat.shadingm",0,0);
                    if ((pIVar17->SpecularHighlight).have == true) {
                      psVar19 = STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>
                                ::Get(&pIVar17->SpecularHighlight);
                      pPVar20 = STEP::EXPRESS::DataType::
                                ToPtr<Assimp::STEP::EXPRESS::PrimitiveDataType<double>>
                                          ((psVar19->
                                           super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                                           )._M_ptr);
                      if (pPVar20 == (PrimitiveDataType<double> *)0x0) {
                        LogFunctions<Assimp::IFCImporter>::LogWarn((char *)0x4dbccf);
                      }
                      else {
                        t = (float)pPVar20->val;
                        aiMaterial::AddProperty
                                  ((aiMaterial *)
                                   _Var14.
                                   super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>
                                   .super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&t,1,
                                   "$mat.shininess",0,0);
                      }
                    }
                  }
                }
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&sel2.
                            super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount);
              }
              mat_1._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
              super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
              super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
                   (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
                   (__uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>)0x0;
              name._0_8_ = uVar6._M_t.
                           super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
                           super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
                           super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
              std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
                        ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials,
                         (aiMaterial **)&name);
              ppaVar4 = (conv->materials).
                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                        super__Vector_impl_data._M_start;
              ppaVar5 = (conv->materials).
                        super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              pmVar21 = std::
                        map<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*,_unsigned_int,_std::less<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*>,_std::allocator<std::pair<const_Assimp::IFC::Schema_2x3::IfcSurfaceStyle_*const,_unsigned_int>_>_>
                        ::operator[](&conv->cached_materials,&surf);
              uVar26 = (int)((ulong)((long)ppaVar5 - (long)ppaVar4) >> 3) - 1;
              unaff_R15 = (ulong)uVar26;
              *pmVar21 = uVar26;
              std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(&mat_1);
              std::__cxx11::string::~string((string *)&side);
            }
            else {
              unaff_R15 = (ulong)*(uint *)&iVar13._M_node[1]._M_parent;
            }
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&sel.
                      super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          p_Var25 = p_Var25 + 1;
          if (pIVar12 != (IfcSurfaceStyle *)0x0) goto LAB_004dbf27;
        }
      }
    }
    _Var22._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var22._M_node);
    pVar28.second._M_node = _Var24._M_node;
    pVar28.first._M_node = _Var22._M_node;
  }
  unaff_R15 = (ulong)prevMatId;
  if (forceDefaultMat && prevMatId == 0xffffffff) {
    name._0_8_ = name._0_8_ & 0xffffff0000000000;
    memset(name.data + 1,0x1b,0x3ff);
    aiString::Set(&name,"<IFCDefault>");
    for (unaff_R15 = 0;
        ppaVar4 = (conv->materials).super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>.
                  _M_impl.super__Vector_impl_data._M_start,
        unaff_R15 <
        (ulong)((long)(conv->materials).
                      super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)ppaVar4 >> 3);
        unaff_R15 = unaff_R15 + 1) {
      _t = _t & 0xffffff0000000000;
      memset(auStack_843,0x1b,0x3ff);
      aiGetMaterialString(ppaVar4[unaff_R15],"?mat.name",0,0,(aiString *)&t);
      bVar9 = aiString::operator==(&name,(aiString *)&t);
      if (bVar9) goto LAB_004dbf27;
    }
    _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
    super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
    super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>)operator_new(0x10);
    aiMaterial::aiMaterial
              ((aiMaterial *)
               _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl);
    mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
    super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
    super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
         (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
         _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
         super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
         super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl;
    aiMaterial::AddProperty
              ((aiMaterial *)
               _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,&name,"?mat.name",0,0);
    _t = (pointer)0x3f19999a3f19999a;
    sStack_840 = 0x3f8000003f19999a;
    aiMaterial::AddProperty
              ((aiMaterial *)
               _Var14.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
               super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
               super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl,(aiColor4D *)&t,1,
               "$clr.diffuse",0,0);
    local_890._M_dataplus._M_p = (pointer)mat;
    mat._M_t.super___uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>._M_t.
    super__Tuple_impl<0UL,_aiMaterial_*,_std::default_delete<aiMaterial>_>.
    super__Head_base<0UL,_aiMaterial_*,_false>._M_head_impl =
         (__uniq_ptr_data<aiMaterial,_std::default_delete<aiMaterial>,_true,_true>)
         (__uniq_ptr_impl<aiMaterial,_std::default_delete<aiMaterial>_>)0x0;
    std::vector<aiMaterial*,std::allocator<aiMaterial*>>::emplace_back<aiMaterial*>
              ((vector<aiMaterial*,std::allocator<aiMaterial*>> *)&conv->materials,
               (aiMaterial **)&local_890);
    unaff_R15 = (ulong)((int)((ulong)((long)(conv->materials).
                                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)(conv->materials).
                                           super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
    std::unique_ptr<aiMaterial,_std::default_delete<aiMaterial>_>::~unique_ptr(&mat);
  }
LAB_004dbf27:
  return (uint)unaff_R15;
}

Assistant:

unsigned int ProcessMaterials(uint64_t id, unsigned int prevMatId, ConversionData& conv, bool forceDefaultMat) {
    STEP::DB::RefMapRange range = conv.db.GetRefs().equal_range(id);
    for(;range.first != range.second; ++range.first) {
        if(const IFC::Schema_2x3::IfcStyledItem* const styled = conv.db.GetObject((*range.first).second)->ToPtr<IFC::Schema_2x3::IfcStyledItem>()) {
            for(const IFC::Schema_2x3::IfcPresentationStyleAssignment& as : styled->Styles) {
                for(std::shared_ptr<const IFC::Schema_2x3::IfcPresentationStyleSelect> sel : as.Styles) {

                    if( const IFC::Schema_2x3::IfcSurfaceStyle* const surf = sel->ResolveSelectPtr<IFC::Schema_2x3::IfcSurfaceStyle>(conv.db) ) {
                        // try to satisfy from cache
                        ConversionData::MaterialCache::iterator mit = conv.cached_materials.find(surf);
                        if( mit != conv.cached_materials.end() )
                            return mit->second;

                        // not found, create new material
                        const std::string side = static_cast<std::string>(surf->Side);
                        if( side != "BOTH" ) {
                            IFCImporter::LogWarn("ignoring surface side marker on IFC::IfcSurfaceStyle: " + side);
                        }

                        std::unique_ptr<aiMaterial> mat(new aiMaterial());

                        FillMaterial(mat.get(), surf, conv);

                        conv.materials.push_back(mat.release());
                        unsigned int matindex = static_cast<unsigned int>(conv.materials.size() - 1);
                        conv.cached_materials[surf] = matindex;
                        return matindex;
                    }
                }
            }
        }
    }

    // no local material defined. If there's global one, use that instead
    if ( prevMatId != std::numeric_limits<uint32_t>::max() ) {
        return prevMatId;
    }

    // we're still here - create an default material if required, or simply fail otherwise
    if ( !forceDefaultMat ) {
        return std::numeric_limits<uint32_t>::max();
    }

    aiString name;
    name.Set("<IFCDefault>");
    //  ConvertColorToString( color, name);

    // look if there's already a default material with this base color
    for( size_t a = 0; a < conv.materials.size(); ++a ) {
        aiString mname;
        conv.materials[a]->Get(AI_MATKEY_NAME, mname);
        if ( name == mname ) {
            return ( unsigned int )a;
        }
    }

    // we're here, yet - no default material with suitable color available. Generate one
    std::unique_ptr<aiMaterial> mat(new aiMaterial());
    mat->AddProperty(&name,AI_MATKEY_NAME);

    const aiColor4D col = aiColor4D( 0.6f, 0.6f, 0.6f, 1.0f); // aiColor4D( color.r, color.g, color.b, 1.0f);
    mat->AddProperty(&col,1, AI_MATKEY_COLOR_DIFFUSE);

    conv.materials.push_back(mat.release());
    return (unsigned int) conv.materials.size() - 1;
}